

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall google::protobuf::io::CordInputStream::LoadChunkData(CordInputStream *this)

{
  char **ppcVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  long in_RSI;
  ulong n;
  
  if (this->bytes_remaining_ == 0) {
    this->size_ = 0;
    this->available_ = 0;
  }
  else {
    if ((this->it_).chunk_iterator_.bytes_remaining_ == 0) {
      LoadChunkData();
      if (this->size_ == 0) {
        return false;
      }
      n = (this->size_ - this->available_) + in_RSI;
      uVar2 = (this->it_).chunk_iterator_.bytes_remaining_;
      if (n <= uVar2) {
        uVar3 = (this->it_).chunk_iterator_.current_chunk_._M_len;
        sVar6 = uVar3 - n;
        if (uVar3 < n || sVar6 == 0) {
          if (n != 0) {
            lVar5 = (long)(this->it_).chunk_iterator_.btree_reader_.navigator_.height_;
            if ((lVar5 < 0) ||
               ((this->it_).chunk_iterator_.btree_reader_.navigator_.node_[lVar5] ==
                (CordRepBtree *)0x0)) {
              (this->it_).chunk_iterator_.bytes_remaining_ = 0;
            }
            else {
              absl::lts_20240722::Cord::ChunkIterator::AdvanceBytesBtree
                        (&(this->it_).chunk_iterator_,n);
            }
          }
        }
        else {
          ppcVar1 = &(this->it_).chunk_iterator_.current_chunk_._M_str;
          *ppcVar1 = *ppcVar1 + n;
          (this->it_).chunk_iterator_.current_chunk_._M_len = sVar6;
          (this->it_).chunk_iterator_.bytes_remaining_ = uVar2 - n;
        }
        this->bytes_remaining_ = this->bytes_remaining_ - in_RSI;
        bVar4 = LoadChunkData(this);
        return bVar4;
      }
      __assert_fail("bytes_remaining_ >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x647,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
    }
    sVar6 = (this->it_).chunk_iterator_.current_chunk_._M_len;
    this->data_ = (this->it_).chunk_iterator_.current_chunk_._M_str;
    this->available_ = sVar6;
    this->size_ = sVar6;
  }
  return this->bytes_remaining_ != 0;
}

Assistant:

bool CordInputStream::LoadChunkData() {
  if (bytes_remaining_ != 0) {
    absl::string_view sv = absl::Cord::ChunkRemaining(it_);
    data_ = sv.data();
    size_ = available_ = sv.size();
    return true;
  }
  size_ = available_ = 0;
  return false;
}